

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1c0a25::FilteredDirectoryContentsTask::inputsAvailable
          (FilteredDirectoryContentsTask *this,TaskInterface ti)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Kind KVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  long lVar8;
  pointer pSVar9;
  pointer pbVar10;
  pointer pbVar11;
  bool bVar12;
  MATCH_RESULT MVar13;
  FileInfo *this_01;
  char *pcVar14;
  ulong uVar15;
  undefined8 uVar16;
  Child CVar17;
  pointer pSVar18;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __i;
  long lVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> values;
  StringRef SVar21;
  error_code eVar22;
  error_code ec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> filterStrings;
  string filename;
  allocator local_17a;
  allocator local_179;
  string local_178;
  TaskInterface local_158;
  error_code local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  directory_iterator local_118;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_100;
  Child local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  Child CStack_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 local_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 local_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 local_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined8 local_80;
  directory_iterator local_78;
  string local_60;
  StringRef local_40;
  
  local_158.ctx = ti.ctx;
  local_158.impl = ti.impl;
  KVar1 = (this->directoryValue).kind;
  if (KVar1 == ExistingInput) {
    this_01 = llbuild::buildsystem::BuildValue::getOutputInfo(&this->directoryValue);
    bVar12 = llbuild::basic::FileInfo::isDirectory(this_01);
    if (bVar12) {
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_40.Data = (this->path)._M_dataplus._M_p;
      local_40.Length = (this->path)._M_string_length;
      llbuild::basic::StringList::getValues(&local_100,&this->filters);
      local_148._M_value = 0;
      local_148._M_cat = (error_category *)std::_V2::system_category();
      llvm::Twine::Twine((Twine *)&local_e8,&local_40);
      uVar16 = 1;
      llvm::sys::fs::directory_iterator::directory_iterator
                (&local_118,(Twine *)&local_e8,&local_148,true);
      local_78.State.
      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_78.State.
      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_78.FollowSymlinks = true;
      local_78._17_7_ = 0;
      bVar12 = llvm::sys::fs::directory_iterator::operator==(&local_118,&local_78);
      CVar17._4_4_ = local_e8._4_4_;
      CVar17.decUI = local_e8.decUI;
      if ((!bVar12) && (local_e8 = CVar17, local_148._M_value == 0)) {
        do {
          CVar17.twine = (Twine *)&CStack_d8;
          SVar21.Length = 2;
          SVar21.Data = (char *)((local_118.State.
                                  super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->CurrentEntry).Path._M_string_length;
          SVar21 = llvm::sys::path::filename
                             ((path *)((local_118.State.
                                        super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->CurrentEntry).Path._M_dataplus._M_p,SVar21,
                              (Style)uVar16);
          pcVar14 = SVar21.Data;
          if (pcVar14 == (char *)0x0) {
            uStack_e0 = 0;
            uStack_dc = 0;
            CStack_d8.decUI = CStack_d8.decUI & 0xffffff00;
            pSVar18 = local_100.
                      super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pSVar9 = local_100.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            local_e8.twine = CVar17.twine;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e8,pcVar14,pcVar14 + SVar21.Length);
            pSVar18 = local_100.
                      super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                      super__Vector_impl_data._M_start;
            CVar17 = local_e8;
            pSVar9 = local_100.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          for (; local_e8 = CVar17, pSVar18 != pSVar9; pSVar18 = pSVar18 + 1) {
            std::__cxx11::string::string((string *)&local_178,pSVar18->Data,&local_179);
            std::__cxx11::string::string((string *)&local_60,local_e8.cString,&local_17a);
            MVar13 = llbuild::basic::sys::filenameMatch(&local_178,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
            if (MVar13 == MATCH) goto LAB_0016a33f;
            CVar17 = local_e8;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_138,(value_type *)&local_e8);
LAB_0016a33f:
          if (&(local_e8.twine)->LHS != &CStack_d8) {
            operator_delete(local_e8.twine,CONCAT44(CStack_d8._4_4_,CStack_d8.decUI) + 1);
          }
          eVar22 = llvm::sys::fs::detail::directory_iterator_increment
                             (local_118.State.
                              super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
          local_148._M_cat = eVar22._M_cat;
          local_148._M_value = eVar22._M_value;
          llvm::sys::fs::directory_iterator::update_error_code_for_current_entry
                    (&local_118,&local_148);
          this_00 = &local_118.State.
                     super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this_00,this_00);
          bVar12 = llvm::sys::fs::directory_iterator::operator==(&local_118,&local_78);
        } while ((!bVar12) && (local_148._M_value == 0));
      }
      if (local_78.State.
          super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.State.
                   super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_118.State.
          super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.State.
                   super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      pbVar11 = local_138.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar10 = local_138.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_138.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_138.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar19 = (long)local_138.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_138.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar15 = lVar19 >> 5;
        lVar8 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar8 == 0; lVar8 = lVar8 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::FilteredDirectoryContentsTask::getFilteredContents(llvm::StringRef,llbuild::basic::StringList_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                  (local_138.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_138.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar19 < 0x201) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::FilteredDirectoryContentsTask::getFilteredContents(llvm::StringRef,llbuild::basic::StringList_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                    (pbVar10,pbVar11);
        }
        else {
          pbVar20 = pbVar10 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::FilteredDirectoryContentsTask::getFilteredContents(llvm::StringRef,llbuild::basic::StringList_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                    (pbVar10,pbVar20);
          for (; pbVar20 != pbVar11; pbVar20 = pbVar20 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::FilteredDirectoryContentsTask::getFilteredContents(llvm::StringRef,llbuild::basic::StringList_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                      (pbVar20);
          }
        }
      }
      if (local_100.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.
                        super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_100.
                              super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.
                              super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      values.Length =
           (long)local_138.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_138.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
      values.Data = local_138.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      llbuild::buildsystem::BuildValue::BuildValue
                ((BuildValue *)&local_e8,FilteredDirectoryContents,values);
      llbuild::buildsystem::BuildValue::toData((ValueType *)&local_178,(BuildValue *)&local_e8);
      llbuild::core::TaskInterface::complete(&local_158,(ValueType *)&local_178,false);
      if (local_178._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_178._M_dataplus._M_p,
                        local_178.field_2._M_allocated_capacity - (long)local_178._M_dataplus._M_p);
      }
      llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_138);
      return;
    }
    uVar2 = this_01->device;
    uVar3 = this_01->inode;
    uVar4 = this_01->mode;
    uVar5 = this_01->size;
    uVar6 = (this_01->modTime).seconds;
    uVar7 = (this_01->modTime).nanoseconds;
    local_178._M_dataplus._M_p = *(pointer *)(this_01->checksum).bytes;
    local_178._M_string_length = *(size_type *)((this_01->checksum).bytes + 8);
    local_178.field_2._M_allocated_capacity = *(undefined8 *)((this_01->checksum).bytes + 0x10);
    local_178.field_2._8_8_ = *(undefined8 *)((this_01->checksum).bytes + 0x18);
    if ((((uVar4 == 0 && uVar5 == 0) && (uVar2 == 0 && uVar3 == 0)) && uVar6 == 0) && uVar7 == 0) {
      __assert_fail("!outputInfo.isMissing()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                    ,0x113,
                    "static BuildValue llbuild::buildsystem::BuildValue::makeExistingInput(FileInfo)"
                   );
    }
    local_e8.decUI = 2;
    local_e8._4_4_ = 1;
    CStack_d8.decUI = (uint)uVar2;
    CStack_d8._4_4_ = (undefined4)(uVar2 >> 0x20);
    uStack_d0 = (undefined4)uVar3;
    uStack_cc = (undefined4)(uVar3 >> 0x20);
    uStack_c8 = (undefined4)uVar4;
    local_c4 = (undefined4)(uVar4 >> 0x20);
    uStack_c0 = (undefined4)uVar5;
    uStack_bc = (undefined4)(uVar5 >> 0x20);
    uStack_b8 = (undefined4)uVar6;
    uStack_b4 = (undefined4)(uVar6 >> 0x20);
    uStack_b0 = (undefined4)uVar7;
    uStack_ac = (undefined4)(uVar7 >> 0x20);
    uStack_a8 = SUB84(local_178._M_dataplus._M_p,0);
    local_a4 = (undefined4)((ulong)local_178._M_dataplus._M_p >> 0x20);
    uStack_a0 = (undefined4)local_178._M_string_length;
    uStack_9c = (undefined4)(local_178._M_string_length >> 0x20);
    uStack_98 = (undefined4)local_178.field_2._M_allocated_capacity;
    local_94 = (undefined4)(local_178.field_2._M_allocated_capacity >> 0x20);
    uStack_90 = (undefined4)local_178.field_2._8_8_;
    uStack_8c = (undefined4)((ulong)local_178.field_2._8_8_ >> 0x20);
  }
  else {
    if (KVar1 == MissingInput) {
      local_e8.decUI = 3;
    }
    else {
      local_e8.decUI = 9;
    }
    local_e8._4_4_ = 0;
    CStack_d8.decUI = 0;
    CStack_d8._4_4_ = 0;
    uStack_d0 = 0;
    uStack_cc = 0;
    uStack_c8 = 0;
    local_c4 = 0;
    uStack_c0 = 0;
    uStack_bc = 0;
    uStack_b8 = 0;
    uStack_b4 = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
    uStack_a8 = 0;
    local_a4 = 0;
    uStack_a0 = 0;
    uStack_9c = 0;
    uStack_98 = 0;
    local_94 = 0;
    uStack_90 = 0;
    uStack_8c = 0;
  }
  uStack_84 = 0;
  uStack_88 = 0;
  uStack_dc = 0;
  uStack_e0 = 0;
  local_80 = 0;
  llbuild::buildsystem::BuildValue::toData((ValueType *)&local_178,(BuildValue *)&local_e8);
  llbuild::core::TaskInterface::complete(&local_158,(ValueType *)&local_178,false);
  if (local_178._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_178._M_dataplus._M_p,
                    local_178.field_2._M_allocated_capacity - (long)local_178._M_dataplus._M_p);
  }
  llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_e8);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    if (directoryValue.isMissingInput()) {
      ti.complete(BuildValue::makeMissingInput().toData());
      return;
    }

    if (!directoryValue.isExistingInput()) {
      ti.complete(BuildValue::makeFailedInput().toData());
      return;
    }

    auto& info = directoryValue.getOutputInfo();

    // Non-directory things are just plain-ol' inputs
    if (!info.isDirectory()) {
      ti.complete(BuildValue::makeExistingInput(info).toData());
      return;
    }

    // Collect the filtered contents
    std::vector<std::string> filenames;
    getFilteredContents(path, filters, filenames);

    // Create the result.
    ti.complete(BuildValue::makeFilteredDirectoryContents(filenames).toData());
  }